

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O2

HRESULT __thiscall ConfigParser::SetOutputFile(ConfigParser *this,WCHAR *outputFile,WCHAR *openMode)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  int iVar4;
  HRESULT HVar5;
  char16_t *pcVar6;
  size_t sVar7;
  size_t sVar8;
  PAL_FILE *file;
  undefined4 *puVar9;
  size_t sVar10;
  char16_t *_Dst;
  char16 local_668 [4];
  char16 moduleName [260];
  WCHAR local_458 [4];
  WCHAR buffer [260];
  char16_t local_248 [4];
  char16 fileName [260];
  
  pcVar6 = PAL_wcsstr(outputFile,L"{PID}");
  if (pcVar6 != (char16_t *)0x0) {
    sVar10 = (long)pcVar6 - (long)outputFile >> 1;
    wcsncpy_s(local_458,0x104,outputFile,sVar10);
    _Dst = (char16_t *)((long)local_458 + ((long)pcVar6 - (long)outputFile));
    sVar10 = 0x104 - sVar10;
    DVar3 = GetCurrentProcessId();
    _itow_s(DVar3,_Dst,sVar10,10);
    sVar7 = PAL_wcslen(_Dst);
    sVar8 = PAL_wcslen(_Dst + sVar7);
    wcscpy_s(_Dst + sVar7,sVar10 - sVar8,pcVar6 + 5);
    outputFile = local_458;
  }
  PlatformAgnostic::SystemInfo::GetBinaryLocation(local_668,0x104);
  _wsplitpath_s(local_668,(WCHAR *)0x0,0,(WCHAR *)0x0,0,local_248,0x104,(WCHAR *)0x0,0);
  iVar4 = _wcsicmp(local_248,L"WWAHost");
  if ((((iVar4 == 0) || (iVar4 = _wcsicmp(local_248,L"ByteCodeGenerator"), iVar4 == 0)) ||
      (iVar4 = _wcsicmp(local_248,L"spartan"), iVar4 == 0)) ||
     (iVar4 = _wcsicmp(local_248,L"spartan_edge"), iVar4 == 0)) {
LAB_00356092:
    DVar3 = GetEnvironmentVariableW(L"temp",local_248,0x104);
    if (DVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                         ,700,"(0)","Get temp environment failed");
      if (!bVar2) goto LAB_003561b8;
      *puVar9 = 0;
      outputFile = local_248;
    }
    else {
      wcscat_s(local_248,0x104,L"\\");
      pcVar6 = PAL_wcsrchr(outputFile,L'\\');
      if (pcVar6 != (char16_t *)0x0) {
        outputFile = pcVar6;
      }
      wcscat_s(local_248,0x104,outputFile);
      outputFile = local_248;
    }
  }
  else {
    sVar7 = PAL_wcslen(L"MicrosoftEdge");
    iVar4 = _wcsnicmp(local_248,L"MicrosoftEdge",sVar7);
    if (iVar4 == 0) goto LAB_00356092;
  }
  file = _wfsopen(outputFile,openMode,0x20);
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x2c8,"(false)","Could not open file for logging output.");
    if (!bVar2) {
LAB_003561b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
    HVar5 = -0x7fffbffb;
  }
  else {
    Output::SetOutputFile(file);
    HVar5 = 0;
  }
  return HVar5;
}

Assistant:

HRESULT ConfigParser::SetOutputFile(const WCHAR* outputFile, const WCHAR* openMode)
{
    // If present, replace the {PID} token with the process ID
    const WCHAR* pidStr = nullptr;
    WCHAR buffer[_MAX_PATH];
    if ((pidStr = wcsstr(outputFile, _u("{PID}"))) != nullptr)
    {
        size_t pidStartPosition = pidStr - outputFile;

        WCHAR* pDest = buffer;
        size_t bufferLen = _MAX_PATH;

        // Copy the filename before the {PID} token
        wcsncpy_s(pDest, bufferLen, outputFile, pidStartPosition);
        pDest += pidStartPosition;
        bufferLen = bufferLen - pidStartPosition;

        // Copy the PID
        _itow_s(GetCurrentProcessId(), pDest, /*bufferSize=*/_MAX_PATH - pidStartPosition, /*radix=*/10);
#pragma prefast(suppress: 26014, "ultow string length is smaller than 256")
        pDest += wcslen(pDest);
        bufferLen = bufferLen - wcslen(pDest);

        // Copy the rest of the string.
#pragma prefast(suppress: 26014, "Overwriting pDset's null terminator is intentional since the string being copied is null terminated")
        wcscpy_s(pDest, bufferLen, outputFile + pidStartPosition + /*length of {PID}*/ 5);

        outputFile = buffer;
    }

    char16 fileName[_MAX_PATH];
    char16 moduleName[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(moduleName, _MAX_PATH);
    _wsplitpath_s(moduleName, nullptr, 0, nullptr, 0, fileName, _MAX_PATH, nullptr, 0);
    if (_wcsicmp(fileName, _u("WWAHost")) == 0 ||
        _wcsicmp(fileName, _u("ByteCodeGenerator")) == 0 ||
        _wcsicmp(fileName, _u("spartan")) == 0 ||
        _wcsicmp(fileName, _u("spartan_edge")) == 0 ||
        _wcsnicmp(fileName, _u("MicrosoftEdge"), wcslen(_u("MicrosoftEdge"))) == 0)
    {

        // we need to output to %temp% directory in wwa. we don't have permission otherwise.
        if (GetEnvironmentVariable(_u("temp"), fileName, _MAX_PATH) != 0)
        {
            wcscat_s(fileName, _MAX_PATH, _u("\\"));
            const char16 * fileNameOnly = wcsrchr(outputFile, _u('\\'));
            // if outputFile is full path we just need filename, discard the path
            wcscat_s(fileName, _MAX_PATH, fileNameOnly == nullptr ? outputFile : fileNameOnly);
        }
        else
        {
            AssertMsg(FALSE, "Get temp environment failed");
        }
        outputFile = fileName;
    }

    FILE *fp;
    if ((fp = _wfsopen(outputFile, openMode, _SH_DENYWR)) != nullptr)
    {
        Output::SetOutputFile(fp);
        return S_OK;
    }

    AssertMsg(false, "Could not open file for logging output.");
    return E_FAIL;
}